

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

void __thiscall
bf_crc::show_hit(bf_crc *this,crc_model_t model,
                vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_> *test_vectors)

{
  ostream *poVar1;
  size_type sVar2;
  reference this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_> *in_RSI;
  char *pcVar4;
  long in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  byte in_stack_00000014;
  byte in_stack_00000015;
  int in_stack_00000018;
  int *in_stack_fffffffffffff8e8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  bf_crc *in_stack_fffffffffffff918;
  allocator<char> *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  bf_crc *in_stack_fffffffffffff938;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  code *message;
  string local_c8 [38];
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  if ((*(byte *)(in_RDI + 0x39) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "----------------------------[ MATCH ]--------------------------------\n"
                            );
    poVar1 = std::operator<<(poVar1,"Found a model for the CRC calculation:\n");
    poVar1 = std::operator<<(poVar1,"Truncated polynom : 0x");
    message = std::hex;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000008);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000008);
    poVar1 = std::operator<<(poVar1,")\n");
    poVar1 = std::operator<<(poVar1,"Initial value     : 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,message);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_0000000c);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_0000000c);
    poVar1 = std::operator<<(poVar1,")\n");
    poVar1 = std::operator<<(poVar1,"Final XOR         : 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,message);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000010);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000010);
    poVar1 = std::operator<<(poVar1,")\n");
    poVar1 = std::operator<<(poVar1,"Reflected input   : ");
    bool_to_str_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0));
    poVar1 = std::operator<<(poVar1,local_30);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"Reflected output  : ");
    bool_to_str_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0));
    poVar1 = std::operator<<(poVar1,local_60);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"Feed type         : ");
    feed_type_to_str_abi_cxx11_
              (in_stack_fffffffffffff938,(FEED_TYPE)((ulong)in_stack_fffffffffffff930 >> 0x20));
    poVar1 = std::operator<<(poVar1,local_80);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_30);
    if (((in_stack_00000018 == 3) || (in_stack_00000018 == 0)) &&
       (sVar2 = std::vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>::size(in_RSI),
       sVar2 != 0)) {
      this_00 = std::vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>::operator[](in_RSI,0)
      ;
      sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this_00->message);
      if ((sVar2 & 7) == 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------[ Example implementation ]--------------------------------"
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"#include <stdint.h>");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"#include <stdio.h>");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"#define STANDARD_FEEDING (7-i)");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"#define BYTEWISE_REVERSE_FEEDING (i)");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"#define FEEDING ");
        pcVar4 = "STANDARD_FEEDING";
        if ((in_stack_00000014 & 1) == 1) {
          pcVar4 = "BYTEWISE_REVERSE_FEEDING";
        }
        poVar1 = std::operator<<(poVar1,pcVar4);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        local_a2 = 0;
        if ((in_stack_00000015 & 1) == 1) {
          show_reflect_output_abi_cxx11_(in_stack_fffffffffffff918);
        }
        else {
          std::allocator<char>::allocator();
          local_a2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920);
        }
        poVar1 = std::operator<<(poVar1,local_a0);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,
                                 "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {"
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  uint16_t crc = initial;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  unsigned int i, k;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  for(k = 0; k < len; k++ ) {");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"    for(i = 0; i < 8; i++ ) {");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"      int bit = ((buf[k] >> FEEDING & 1) == 1);");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"      int c15 = ((crc >> 15 & 1) == 1);");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"      crc <<= 1;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"      if(c15 ^ bit) crc ^= poly;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"    }");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  }");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        pcVar4 = "";
        if ((in_stack_00000015 & 1) != 0) {
          pcVar4 = "  crc = reflect_output(crc);";
        }
        poVar1 = std::operator<<(poVar1,pcVar4);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  crc ^= final_xor;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  return crc;");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"}");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"int main(int argc, char * argv) {");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  uint8_t buf[] = { ");
        std::vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>::operator[](in_RSI,0);
        bitset_to_byte_array_abi_cxx11_
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)message);
        poVar1 = std::operator<<(poVar1,local_c8);
        poVar1 = std::operator<<(poVar1,"};");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::operator<<(poVar1,"  uint16_t crc = ");
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
        std::vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>::operator[](in_RSI,0);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
                  (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        poVar1 = (ostream *)
                 boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff960,in_stack_fffffffffffff958);
        poVar1 = std::operator<<(poVar1,";");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        pbVar3 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::operator<<(poVar1,"  if(calc_crc( ");
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (pbVar3,(char *)in_stack_fffffffffffff958);
        f = boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
                      (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        poVar1 = (ostream *)
                 boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)pbVar3,f);
        std::operator<<(poVar1,", ");
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (pbVar3,(char *)f);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
                  (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        poVar1 = (ostream *)
                 boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)pbVar3,f);
        std::operator<<(poVar1,", ");
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (pbVar3,(char *)f);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
                  (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        poVar1 = (ostream *)
                 boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)pbVar3,f);
        poVar1 = std::operator<<(poVar1,", buf, sizeof(buf)) == crc) puts(\"CRC matches\");");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  else puts(\"CRC does not match\");");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"  ");
        pbVar3 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<((ostream *)pbVar3,"}");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                  (pbVar3);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                  (pbVar3);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                  (pbVar3);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                  (pbVar3);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string(local_a0);
        if ((local_a2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_a1);
        }
      }
    }
  }
  return;
}

Assistant:

void bf_crc::show_hit(crc_model_t model, std::vector<test_vector_t> test_vectors) {

  if (quiet_) return;


  std::cout 
    << "----------------------------[ MATCH ]--------------------------------\n"
    << "Found a model for the CRC calculation:\n"
    << "Truncated polynom : 0x" << std::hex << model.polynomial << " (" << std::dec << model.polynomial << ")\n"
    << "Initial value     : 0x" << std::hex << model.initial << " (" << std::dec << model.initial << ")\n"
    << "Final XOR         : 0x" << std::hex << model.final_xor << " (" << std::dec << model.final_xor << ")\n"
    << "Reflected input   : " << bool_to_str(model.reflected_input) << "\n"
    << "Reflected output  : " << bool_to_str(model.reflected_output) << "\n"
    << "Feed type         : " << feed_type_to_str(model.feed_type) << std::endl
    << std::endl << std::flush;

  
  // print an implementation
  
  if((model.feed_type == my_crc_basic::BYTEWISE_REVERSED || model.feed_type == my_crc_basic::AUTO) &&
     (test_vectors.size() > 0) &&
     (test_vectors[0].message.size() % 8 == 0)) {
    
    std::cout 
      << "----------------------------[ Example implementation ]--------------------------------" << std::endl
      << "#include <stdint.h>" << std::endl
      << "#include <stdio.h>" << std::endl
      << std::endl
      << "#define STANDARD_FEEDING (7-i)" << std::endl
      << "#define BYTEWISE_REVERSE_FEEDING (i)" << std::endl
      << "#define FEEDING " << (model.reflected_input == true ? "BYTEWISE_REVERSE_FEEDING" : "STANDARD_FEEDING") << std::endl
      << std::endl
      << (model.reflected_output == true ? show_reflect_output() : std::string("")) << std::endl
      << "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {" << std::endl
      << "  uint16_t crc = initial;" << std::endl
      << "  unsigned int i, k;" << std::endl
      << "" << std::endl
      << "  for(k = 0; k < len; k++ ) {" << std::endl
      << "    for(i = 0; i < 8; i++ ) {" << std::endl
      << "      int bit = ((buf[k] >> FEEDING & 1) == 1);" << std::endl
      << "      int c15 = ((crc >> 15 & 1) == 1);" << std::endl
      << "      crc <<= 1;" << std::endl
      << "      if(c15 ^ bit) crc ^= poly;" << std::endl
      << "    }" << std::endl
      << "  }" << std::endl
      << (model.reflected_output == true ? "  crc = reflect_output(crc);" : "") << std::endl
      << "  crc ^= final_xor;" << std::endl
      << "  return crc;" << std::endl
      << "}" << std::endl
      << std::endl
      << "int main(int argc, char * argv) {" << std::endl
      << "" << std::endl
      << "  uint8_t buf[] = { " << bitset_to_byte_array(test_vectors[0].message) << "};" << std::endl
      << "  uint16_t crc = " << (boost::format("0x%04x") % static_cast<int>(test_vectors[0].crc)) << ";" << std::endl
      << "  " << std::endl
      << "  if(calc_crc( "<< (boost::format("0x%04x") % static_cast<int>(model.polynomial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.initial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.final_xor)) << ", buf, sizeof(buf)) == crc) puts(\"CRC matches\");" << std::endl
      << "  else puts(\"CRC does not match\");" << std::endl
      << "  " << std::endl
      << "}" << std::endl;
    
  }
}